

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_OptionFromDefaultsSubcommands_Test::TestBody(TApp_OptionFromDefaultsSubcommands_Test *this)

{
  bool bVar1;
  OptionBase<CLI::OptionDefaults> *pOVar2;
  char *pcVar3;
  string *psVar4;
  OptionDefaults *pOVar5;
  App *this_00;
  char *in_R9;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__4;
  Message local_228;
  MultiOptionPolicy local_220;
  MultiOptionPolicy local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__3;
  string local_1b8;
  allocator local_191;
  string local_190;
  App *local_170;
  App *app2;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar__1;
  Message local_88;
  MultiOptionPolicy local_80;
  MultiOptionPolicy local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TApp_OptionFromDefaultsSubcommands_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  local_21 = CLI::OptionBase<CLI::OptionDefaults>::get_required(pOVar2);
  local_21 = !local_21;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_20,
               (AssertionResult *)"app.option_defaults()->get_required()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  local_7c = CLI::OptionBase<CLI::OptionDefaults>::get_multi_option_policy(pOVar2);
  local_80 = Throw;
  testing::internal::EqHelper<false>::Compare<CLI::MultiOptionPolicy,CLI::MultiOptionPolicy>
            ((EqHelper<false> *)local_78,"app.option_defaults()->get_multi_option_policy()",
             "CLI::MultiOptionPolicy::Throw",&local_7c,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x130,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  local_a1 = CLI::OptionBase<CLI::OptionDefaults>::get_ignore_case(pOVar2);
  local_a1 = !local_a1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_a0,
               (AssertionResult *)"app.option_defaults()->get_ignore_case()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  local_e9 = CLI::OptionBase<CLI::OptionDefaults>::get_configurable(pOVar2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_e8,
               (AssertionResult *)"app.option_defaults()->get_configurable()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x132,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  psVar4 = CLI::OptionBase<CLI::OptionDefaults>::get_group_abi_cxx11_(pOVar2);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[8]>
            ((EqHelper<false> *)local_130,"app.option_defaults()->get_group()","\"Options\"",psVar4,
             (char (*) [8])"Options");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x133,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  pOVar2 = &CLI::App::option_defaults(&(this->super_TApp).app)->
            super_OptionBase<CLI::OptionDefaults>;
  pOVar5 = CLI::OptionBase<CLI::OptionDefaults>::required(pOVar2,true);
  pOVar5 = CLI::OptionDefaults::multi_option_policy(pOVar5,TakeLast);
  pOVar2 = &CLI::OptionDefaults::ignore_case(pOVar5,true)->super_OptionBase<CLI::OptionDefaults>;
  pOVar2 = &CLI::OptionBase<CLI::OptionDefaults>::configurable(pOVar2,false)->
            super_OptionBase<CLI::OptionDefaults>;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"Something",(allocator *)((long)&app2 + 7));
  CLI::OptionBase<CLI::OptionDefaults>::group(pOVar2,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&app2 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"app2",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
  this_00 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_170 = this_00;
  pOVar2 = &CLI::App::option_defaults(this_00)->super_OptionBase<CLI::OptionDefaults>;
  local_1d1 = CLI::OptionBase<CLI::OptionDefaults>::get_required(pOVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_1d0,
               (AssertionResult *)"app2->option_defaults()->get_required()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x13e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pOVar2 = &CLI::App::option_defaults(local_170)->super_OptionBase<CLI::OptionDefaults>;
  local_21c = CLI::OptionBase<CLI::OptionDefaults>::get_multi_option_policy(pOVar2);
  local_220 = TakeLast;
  testing::internal::EqHelper<false>::Compare<CLI::MultiOptionPolicy,CLI::MultiOptionPolicy>
            ((EqHelper<false> *)local_218,"app2->option_defaults()->get_multi_option_policy()",
             "CLI::MultiOptionPolicy::TakeLast",&local_21c,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  pOVar2 = &CLI::App::option_defaults(local_170)->super_OptionBase<CLI::OptionDefaults>;
  local_241 = CLI::OptionBase<CLI::OptionDefaults>::get_ignore_case(pOVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_240,
               (AssertionResult *)"app2->option_defaults()->get_ignore_case()","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  pOVar2 = &CLI::App::option_defaults(local_170)->super_OptionBase<CLI::OptionDefaults>;
  local_289 = CLI::OptionBase<CLI::OptionDefaults>::get_configurable(pOVar2);
  local_289 = !local_289;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_288,
               (AssertionResult *)"app2->option_defaults()->get_configurable()","true","false",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  pOVar2 = &CLI::App::option_defaults(local_170)->super_OptionBase<CLI::OptionDefaults>;
  psVar4 = CLI::OptionBase<CLI::OptionDefaults>::get_group_abi_cxx11_(pOVar2);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[10]>
            ((EqHelper<false> *)local_2d0,"app2->option_defaults()->get_group()","\"Something\"",
             psVar4,(char (*) [10])"Something");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaultsSubcommands) {
    // Initial defaults
    EXPECT_FALSE(app.option_defaults()->get_required());
    EXPECT_EQ(app.option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::Throw);
    EXPECT_FALSE(app.option_defaults()->get_ignore_case());
    EXPECT_TRUE(app.option_defaults()->get_configurable());
    EXPECT_EQ(app.option_defaults()->get_group(), "Options");

    app.option_defaults()
        ->required()
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast)
        ->ignore_case()
        ->configurable(false)
        ->group("Something");

    auto app2 = app.add_subcommand("app2");

    EXPECT_TRUE(app2->option_defaults()->get_required());
    EXPECT_EQ(app2->option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::TakeLast);
    EXPECT_TRUE(app2->option_defaults()->get_ignore_case());
    EXPECT_FALSE(app2->option_defaults()->get_configurable());
    EXPECT_EQ(app2->option_defaults()->get_group(), "Something");
}